

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomHeap.cpp
# Opt level: O0

void __thiscall
Memory::CustomHeap::Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
FreeAllocationHelper
          (Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this,
          Allocation *object,BVIndex index,uint length)

{
  Page *pPVar1;
  BYTE *buffer;
  char *localAddr;
  Page *page;
  uint length_local;
  BVIndex index_local;
  Allocation *object_local;
  Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this_local;
  
  pPVar1 = (object->field_0).page;
  buffer = (BYTE *)CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
                   ::AllocLocal(this->codePageAllocators,object->address,object->size,
                                pPVar1->segment);
  if (buffer == (BYTE *)0x0) {
    MemoryOperationLastError::RecordError(-0x7ff5e9db);
  }
  else {
    FillDebugBreak(buffer,object->size);
    CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
    FreeLocal(this->codePageAllocators,(char *)buffer,pPVar1->segment);
    if ((DAT_01ec73ca & 1) != 0) {
      Output::Trace(CustomHeapPhase,
                    L"Setting %d bits starting at bit %d, Free bit vector in page was ",
                    (ulong)length,(ulong)index);
    }
    if ((DAT_01ec73ca & 1) != 0) {
      Output::Trace(CustomHeapPhase,L"\n");
    }
    BVUnitT<unsigned_long>::SetRange(&pPVar1->freeBitVector,index,length);
    if ((DAT_01ec73ca & 1) != 0) {
      Output::Trace(CustomHeapPhase,L"Free bit vector in page: ",(ulong)length,(ulong)index);
    }
    if ((DAT_01ec73ca & 1) != 0) {
      Output::Trace(CustomHeapPhase,L"\n");
    }
    this->freeObjectSize = object->size + this->freeObjectSize;
    this->freesSinceLastCompact = object->size + this->freesSinceLastCompact;
    ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              (&this->auxiliaryAllocator->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,object,0x38
              );
  }
  return;
}

Assistant:

void Heap<TAlloc, TPreReservedAlloc>::FreeAllocationHelper(Allocation* object, BVIndex index, uint length)
{
    Page* page = object->page;

    // Fill the old buffer with debug breaks
    char* localAddr = this->codePageAllocators->AllocLocal(object->address, object->size, page->segment);
    if (localAddr)
    {
        FillDebugBreak((BYTE*)localAddr, object->size);
        this->codePageAllocators->FreeLocal(localAddr, page->segment);
    }
    else
    {
        MemoryOperationLastError::RecordError(JSERR_FatalMemoryExhaustion);
        return;
    }
    VerboseHeapTrace(_u("Setting %d bits starting at bit %d, Free bit vector in page was "), length, index);
#if VERBOSE_HEAP
    page->freeBitVector.DumpWord();
#endif
    VerboseHeapTrace(_u("\n"));

    page->freeBitVector.SetRange(index, length);

    VerboseHeapTrace(_u("Free bit vector in page: "), length, index);
#if VERBOSE_HEAP
    page->freeBitVector.DumpWord();
#endif
    VerboseHeapTrace(_u("\n"));

#if DBG_DUMP
    this->freeObjectSize += object->size;
    this->freesSinceLastCompact += object->size;
#endif

    this->auxiliaryAllocator->Free(object, sizeof(Allocation));
}